

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlParseAttValueInternal(xmlParserCtxtPtr ctxt,int *len,int *alloc,int normalize)

{
  byte bVar1;
  xmlChar xVar2;
  xmlParserInputState xVar3;
  xmlParserErrors error;
  bool bVar4;
  byte *pbVar5;
  int *piVar6;
  int *piVar7;
  uint uVar8;
  xmlParserInputPtr pxVar9;
  xmlChar *pxVar10;
  xmlChar *pxVar11;
  xmlEntityPtr pxVar12;
  unsigned_long uVar13;
  xmlChar *pxVar14;
  byte bVar15;
  ulong uVar16;
  ulong uVar17;
  char *msg;
  byte *cur;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  byte *pbVar23;
  byte *pbVar24;
  byte *pbVar25;
  size_t sVar26;
  int iVar27;
  xmlChar xVar28;
  long lVar29;
  byte *local_68;
  int local_4c;
  int *local_48;
  xmlChar *local_40;
  xmlChar *local_38;
  
  uVar8 = 1000000000;
  if ((ctxt->options & 0x80000) == 0) {
    uVar8 = 10000000;
  }
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  pxVar9 = ctxt->input;
  pbVar24 = pxVar9->cur;
  iVar19 = pxVar9->line;
  if ((*pbVar24 != 0x22) && (piVar6 = local_48, *pbVar24 != 0x27)) {
LAB_00156f2b:
    local_48 = piVar6;
    xmlFatalErr(ctxt,XML_ERR_ATTRIBUTE_NOT_STARTED,(char *)0x0);
    return (xmlChar *)0x0;
  }
  iVar27 = pxVar9->col;
  ctxt->instate = XML_PARSER_ATTRIBUTE_VALUE;
  cur = pbVar24 + 1;
  bVar1 = *pbVar24;
  pbVar23 = pxVar9->end;
  if (cur < pbVar23) {
    xVar3 = XML_PARSER_ATTRIBUTE_VALUE;
  }
  else {
    pxVar10 = pxVar9->base;
    xVar3 = XML_PARSER_ATTRIBUTE_VALUE;
    if (((long)pbVar23 - (long)pbVar24 < 0xfa) && (ctxt->progressive == 0)) {
      xmlGROW(ctxt);
      xVar3 = ctxt->instate;
      if (xVar3 == XML_PARSER_EOF) {
        return (xmlChar *)0x0;
      }
    }
    pxVar9 = ctxt->input;
    pbVar23 = pxVar9->end;
    lVar21 = (long)pxVar9->base - (long)pxVar10;
    lVar29 = 0;
    if (lVar21 != 0) {
      lVar29 = lVar21;
    }
    cur = cur + lVar29;
  }
  iVar27 = iVar27 + 1;
  uVar17 = (ulong)uVar8;
  pbVar24 = cur;
  if (normalize == 0) {
    do {
      lVar29 = (long)pbVar24 - (long)cur;
      do {
        if ((((pbVar23 <= pbVar24) || (bVar15 = *pbVar24, (char)bVar15 < ' ' || bVar15 == bVar1)) ||
            (bVar15 == 0x26)) || (bVar15 == 0x3c)) {
          if ((long)uVar17 < lVar29) goto LAB_00156ebe;
          bVar15 = *pbVar24;
          piVar7 = len;
          pbVar25 = pbVar24;
          piVar6 = local_48;
          goto joined_r0x00156edb;
        }
        pbVar24 = pbVar24 + 1;
        iVar27 = iVar27 + 1;
        lVar29 = lVar29 + 1;
      } while (pbVar24 < pbVar23);
      pxVar10 = pxVar9->base;
      if ((ctxt->progressive == 0) && ((long)pxVar9->end - (long)pxVar9->cur < 0xfa)) {
        local_48 = len;
        xmlGROW(ctxt);
        xVar3 = ctxt->instate;
        len = local_48;
      }
      if (xVar3 == XML_PARSER_EOF) {
        return (xmlChar *)0x0;
      }
      pxVar9 = ctxt->input;
      lVar22 = (long)pxVar9->base - (long)pxVar10;
      lVar21 = 0;
      if (lVar22 != 0) {
        lVar21 = lVar22;
      }
      pbVar23 = pxVar9->end;
      cur = cur + lVar21;
      pbVar24 = pbVar24 + lVar21;
    } while (lVar29 <= (long)uVar17);
  }
  else {
    while (((pbVar24 = cur, cur < pbVar23 && (*cur != bVar1)) &&
           ((uVar8 = (uint)*cur, uVar8 < 0x21 && ((0x100002600U >> ((ulong)uVar8 & 0x3f) & 1) != 0))
           ))) {
      iVar27 = iVar27 + 1;
      if (uVar8 == 10) {
        iVar27 = 1;
      }
      iVar19 = iVar19 + (uint)(uVar8 == 10);
      cur = cur + 1;
      if (pbVar23 <= cur) {
        pxVar10 = pxVar9->base;
        if ((ctxt->progressive == 0) && ((long)pxVar9->end - (long)pxVar9->cur < 0xfa)) {
          xmlGROW(ctxt);
          xVar3 = ctxt->instate;
        }
        if (xVar3 == XML_PARSER_EOF) {
          return (xmlChar *)0x0;
        }
        pxVar9 = ctxt->input;
        pbVar23 = pxVar9->end;
        lVar21 = (long)pxVar9->base - (long)pxVar10;
        lVar29 = 0;
        if (lVar21 != 0) {
          lVar29 = lVar21;
        }
        cur = cur + lVar29;
      }
    }
    do {
      lVar29 = (long)pbVar24 - (long)cur;
      do {
        pbVar5 = pbVar24;
        if ((((pbVar23 <= pbVar24) || (bVar15 = *pbVar24, (char)bVar15 < ' ' || bVar15 == bVar1)) ||
            (bVar15 == 0x26)) || (bVar15 == 0x3c)) goto LAB_00156c8d;
        pbVar24 = pbVar24 + 1;
        if ((bVar15 == 0x20) && (*pbVar24 == 0x20)) {
          iVar27 = iVar27 + 1;
          pbVar5 = pbVar24;
          goto LAB_00156c8d;
        }
        lVar29 = lVar29 + 1;
        iVar27 = iVar27 + 1;
      } while (pbVar24 < pbVar23);
      pxVar10 = pxVar9->base;
      if ((ctxt->progressive == 0) && ((long)pxVar9->end - (long)pxVar9->cur < 0xfa)) {
        local_48 = len;
        xmlGROW(ctxt);
        xVar3 = ctxt->instate;
        len = local_48;
      }
      if (xVar3 == XML_PARSER_EOF) {
        return (xmlChar *)0x0;
      }
      pxVar9 = ctxt->input;
      lVar22 = (long)pxVar9->base - (long)pxVar10;
      lVar21 = 0;
      if (lVar22 != 0) {
        lVar21 = lVar22;
      }
      pbVar23 = pxVar9->end;
      cur = cur + lVar21;
      pbVar24 = pbVar24 + lVar21;
    } while (lVar29 <= (long)uVar17);
  }
LAB_00156ebe:
  xmlFatalErrMsg(ctxt,XML_ERR_ATTRIBUTE_NOT_FINISHED,"AttValue length too long\n");
  return (xmlChar *)0x0;
code_r0x00156d07:
  pxVar10 = pxVar9->base;
  if ((ctxt->progressive == 0) && ((long)pxVar9->end - (long)pxVar9->cur < 0xfa)) {
    local_48 = len;
    local_40 = pxVar10;
    xmlGROW(ctxt);
    xVar3 = ctxt->instate;
    pxVar10 = local_40;
    len = local_48;
  }
  if (xVar3 == XML_PARSER_EOF) {
    return (xmlChar *)0x0;
  }
  pxVar9 = ctxt->input;
  pbVar23 = pxVar9->end;
  lVar22 = (long)pxVar9->base - (long)pxVar10;
  lVar21 = 0;
  if (lVar22 != 0) {
    lVar21 = lVar22;
  }
  pbVar25 = pbVar25 + lVar21;
  cur = cur + lVar21;
  pbVar24 = pbVar24 + lVar21;
  if ((long)uVar17 < lVar29) goto LAB_00156ebe;
  goto LAB_00156ca2;
  while (pbVar5 = pbVar25 + -1, cur < pbVar25) {
LAB_00156c8d:
    pbVar25 = pbVar5;
    if (pbVar25[-1] != 0x20) break;
  }
LAB_00156ca2:
  lVar29 = (long)pbVar24 - (long)cur;
  while (((pbVar24 < pbVar23 && (*pbVar24 != bVar1)) &&
         ((uVar8 = (uint)*pbVar24, uVar8 < 0x21 &&
          ((0x100002600U >> ((ulong)uVar8 & 0x3f) & 1) != 0))))) {
    iVar27 = iVar27 + 1;
    if (uVar8 == 10) {
      iVar27 = 1;
    }
    iVar19 = iVar19 + (uint)(uVar8 == 10);
    pbVar24 = pbVar24 + 1;
    lVar29 = lVar29 + 1;
    if (pbVar23 <= pbVar24) goto code_r0x00156d07;
  }
  if ((long)uVar17 < lVar29) goto LAB_00156ebe;
  bVar15 = *pbVar24;
  piVar7 = len;
  piVar6 = local_48;
joined_r0x00156edb:
  local_48 = piVar7;
  if (bVar15 == bVar1) {
    if (local_48 == (int *)0x0) {
      if (alloc != (int *)0x0) {
        *alloc = 1;
      }
      local_48 = piVar6;
      cur = xmlStrndup(cur,(int)pbVar25 - (int)cur);
      pxVar9 = ctxt->input;
    }
    else {
      if (alloc != (int *)0x0) {
        *alloc = 0;
      }
      *local_48 = (int)pbVar25 - (int)cur;
    }
    pxVar9->cur = pbVar24 + 1;
    pxVar9->line = iVar19;
    pxVar9->col = iVar27 + 1;
    return cur;
  }
  if (alloc != (int *)0x0) {
    *alloc = 1;
  }
  uVar17 = 1000000000;
  if (((uint)ctxt->options >> 0x13 & 1) == 0) {
    uVar17 = 10000000;
  }
  if (*pxVar9->cur == '\"') {
    xVar28 = '\"';
  }
  else {
    if (*pxVar9->cur != '\'') goto LAB_00156f2b;
    xVar28 = '\'';
  }
  ctxt->instate = XML_PARSER_ATTRIBUTE_VALUE;
  xmlNextChar(ctxt);
  sVar26 = 100;
  pxVar10 = (xmlChar *)(*xmlMallocAtomic)(100);
  if (pxVar10 == (xmlChar *)0x0) {
    pxVar10 = (xmlChar *)0x0;
LAB_00157683:
    local_68 = (byte *)0x0;
LAB_00157686:
    xmlErrMemory(ctxt,(char *)0x0);
    goto LAB_00157698;
  }
  uVar8 = xmlCurrentChar(ctxt,&local_4c);
  bVar4 = false;
  uVar20 = 0;
  while( true ) {
    local_68 = (byte *)0x0;
    pxVar14 = ctxt->input->cur;
    if (xVar28 == *pxVar14) break;
    if (0xff < (int)uVar8) {
      if ((0xffefffff < uVar8 - 0x110000 || 0xffffe001 < uVar8 - 0xfffe) || uVar8 < 0xd800)
      goto LAB_0015704b;
      break;
    }
    if ((int)uVar8 < 0x20) {
      if ((0xd < uVar8) || ((0x2600U >> (uVar8 & 0x1f) & 1) == 0)) break;
    }
    else if (uVar8 == 0x3c) break;
LAB_0015704b:
    if (ctxt->instate == XML_PARSER_EOF) goto LAB_0015770f;
    pxVar11 = pxVar10;
    if (0x26 < uVar8) {
LAB_00157132:
      if (local_4c == 1) {
        pxVar10[uVar20] = (xmlChar)uVar8;
        uVar20 = uVar20 + 1;
      }
      else {
        iVar19 = xmlCopyCharMultiByte(pxVar10 + uVar20,uVar8);
        uVar20 = uVar20 + (long)iVar19;
      }
      if (uVar20 + 10 <= sVar26) {
        bVar4 = false;
LAB_001572af:
        pxVar9 = ctxt->input;
        if (*pxVar9->cur == '\n') {
          pxVar9->line = pxVar9->line + 1;
          pxVar9->col = 1;
        }
        else {
          pxVar9->col = pxVar9->col + 1;
        }
        pxVar9->cur = pxVar9->cur + local_4c;
        pxVar10 = pxVar11;
        goto LAB_001572d7;
      }
      uVar16 = sVar26 * 2 + 10;
      if (sVar26 <= uVar16) {
        pxVar11 = (xmlChar *)(*xmlRealloc)(pxVar10,uVar16);
        if (pxVar11 != (xmlChar *)0x0) {
          bVar4 = false;
          sVar26 = uVar16;
          goto LAB_001572af;
        }
LAB_001577d2:
        local_68 = (byte *)0x0;
      }
      goto LAB_00157686;
    }
    if ((0x100002600U >> ((ulong)uVar8 & 0x3f) & 1) != 0) {
      if ((normalize == 0) || (uVar20 != 0)) {
        if (normalize == 0 || !bVar4) {
          if (local_4c == 1) {
            pxVar10[uVar20] = ' ';
            uVar20 = uVar20 + 1;
          }
          else {
            iVar19 = xmlCopyCharMultiByte(pxVar10 + uVar20,0x20);
            uVar20 = uVar20 + (long)iVar19;
          }
          while (sVar26 < uVar20 + 10) {
            uVar16 = sVar26 * 2 + 10;
            pxVar10 = pxVar11;
            if ((uVar16 < sVar26) ||
               (pxVar11 = (xmlChar *)(*xmlRealloc)(pxVar11,uVar16), sVar26 = uVar16,
               pxVar11 == (xmlChar *)0x0)) goto LAB_00157686;
          }
          bVar4 = true;
        }
        else {
          bVar4 = true;
        }
      }
      else {
        uVar20 = 0;
      }
      goto LAB_001572af;
    }
    if ((ulong)uVar8 != 0x26) goto LAB_00157132;
    if (pxVar14[1] != '#') {
      pxVar12 = xmlParseEntityRef(ctxt);
      uVar13 = ctxt->nbentities + 1;
      ctxt->nbentities = uVar13;
      bVar4 = false;
      if (pxVar12 == (xmlEntityPtr)0x0) goto LAB_001572d7;
      ctxt->nbentities = uVar13 + (long)pxVar12->owner;
      if (pxVar12->etype == XML_INTERNAL_PREDEFINED_ENTITY) {
        if (sVar26 < uVar20 + 10) {
          sVar26 = sVar26 * 2 + 10;
          pxVar11 = (xmlChar *)(*xmlRealloc)(pxVar10,sVar26);
          if (pxVar11 == (xmlChar *)0x0) goto LAB_00157686;
        }
        if (*pxVar12->content == '&' && ctxt->replaceEntities == 0) {
          builtin_memcpy(pxVar11 + uVar20,"&#38;",5);
          uVar20 = uVar20 + 5;
        }
        else {
          pxVar11[uVar20] = *pxVar12->content;
          uVar20 = uVar20 + 1;
        }
        goto LAB_001575e1;
      }
      if (ctxt->replaceEntities == 0) {
        iVar19 = xmlStrlen(pxVar12->name);
        local_40 = (xmlChar *)CONCAT44(local_40._4_4_,iVar19);
        local_38 = pxVar12->name;
        if (((pxVar12->etype != XML_INTERNAL_PREDEFINED_ENTITY) &&
            (pxVar14 = pxVar12->content, pxVar14 != (xmlChar *)0x0)) && (pxVar12->checked == 0)) {
          uVar13 = ctxt->nbentities;
          ctxt->depth = ctxt->depth + 1;
          pxVar14 = xmlStringDecodeEntities(ctxt,pxVar14,1,'\0','\0','\0');
          ctxt->depth = ctxt->depth + -1;
          uVar16 = (ctxt->nbentities - uVar13) + 1;
          if (0x3ffffffe < uVar16) {
            uVar16 = 0x3fffffff;
          }
          pxVar12->checked = (int)uVar16 * 2;
          if (pxVar14 == (xmlChar *)0x0) {
            *pxVar12->content = '\0';
          }
          else {
            pxVar11 = xmlStrchr(pxVar14,'<');
            if (pxVar11 != (xmlChar *)0x0) {
              *(byte *)&pxVar12->checked = (byte)pxVar12->checked | 1;
            }
            (*xmlFree)(pxVar14);
          }
        }
        pxVar10[uVar20] = '&';
        lVar29 = (long)(int)local_40;
        pxVar14 = pxVar10;
        do {
          pxVar10 = pxVar14;
          local_68 = (byte *)0x0;
          if (lVar29 + uVar20 + 0xb <= sVar26) {
            uVar20 = uVar20 + 2;
            pxVar14 = local_38;
            for (iVar19 = (int)local_40; 0 < iVar19; iVar19 = iVar19 + -1) {
              xVar2 = *pxVar14;
              pxVar14 = pxVar14 + 1;
              pxVar10[uVar20 - 1] = xVar2;
              uVar20 = uVar20 + 1;
            }
            pxVar10[uVar20 - 1] = ';';
            goto LAB_001572d7;
          }
          uVar16 = lVar29 + 10 + sVar26 * 2;
        } while ((sVar26 <= uVar16) &&
                (pxVar14 = (xmlChar *)(*xmlRealloc)(pxVar10,uVar16), sVar26 = uVar16,
                pxVar14 != (xmlChar *)0x0));
      }
      else {
        ctxt->depth = ctxt->depth + 1;
        bVar4 = false;
        local_68 = xmlStringDecodeEntities(ctxt,pxVar12->content,1,'\0','\0','\0');
        ctxt->depth = ctxt->depth + -1;
        pbVar24 = local_68;
        pxVar14 = pxVar10;
        if (local_68 == (byte *)0x0) goto LAB_001572d7;
        do {
          pxVar10 = pxVar14;
          bVar1 = *pbVar24;
          bVar15 = 0x20;
          if (((1 < bVar1 - 9) && (bVar1 != 0xd)) && (bVar15 = bVar1, bVar1 == 0)) {
            (*xmlFree)(local_68);
            goto LAB_00157444;
          }
          pxVar10[uVar20] = bVar15;
          uVar16 = uVar20 + 1;
          pbVar24 = pbVar24 + 1;
          uVar18 = uVar20 + 0xb;
          uVar20 = uVar16;
          pxVar14 = pxVar10;
        } while ((uVar18 <= sVar26) ||
                ((uVar16 = sVar26 * 2 + 10, sVar26 <= uVar16 &&
                 (pxVar14 = (xmlChar *)(*xmlRealloc)(pxVar10,uVar16), sVar26 = uVar16,
                 pxVar14 != (xmlChar *)0x0))));
      }
      goto LAB_00157686;
    }
    iVar19 = xmlParseCharRef(ctxt);
    if (iVar19 != 0) {
      uVar16 = uVar20 + 10;
      if (iVar19 == 0x26) {
        if (ctxt->replaceEntities == 0) {
          if (sVar26 < uVar16) {
            sVar26 = sVar26 * 2 + 10;
            pxVar11 = (xmlChar *)(*xmlRealloc)(pxVar10,sVar26);
            if (pxVar11 == (xmlChar *)0x0) goto LAB_00157686;
          }
          builtin_memcpy(pxVar11 + uVar20,"&#38;",5);
          uVar20 = uVar20 + 5;
        }
        else {
          if (sVar26 < uVar16) {
            sVar26 = sVar26 * 2 + 10;
            pxVar11 = (xmlChar *)(*xmlRealloc)(pxVar10,sVar26);
            if (pxVar11 == (xmlChar *)0x0) goto LAB_00157686;
          }
          pxVar11[uVar20] = '&';
          uVar20 = uVar20 + 1;
        }
LAB_001575e1:
        bVar4 = false;
        pxVar10 = pxVar11;
        goto LAB_001572d7;
      }
      pxVar14 = pxVar10;
      if (sVar26 < uVar16) {
        sVar26 = sVar26 * 2 + 10;
        pxVar14 = (xmlChar *)(*xmlRealloc)(pxVar10,sVar26);
        if (pxVar14 == (xmlChar *)0x0) goto LAB_001577d2;
      }
      pxVar10 = pxVar14;
      iVar19 = xmlCopyChar(0,pxVar10 + uVar20,iVar19);
      uVar20 = uVar20 + (long)iVar19;
    }
LAB_00157444:
    bVar4 = false;
LAB_001572d7:
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
    uVar8 = xmlCurrentChar(ctxt,&local_4c);
    if (uVar17 < uVar20) {
      xmlFatalErrMsg(ctxt,XML_ERR_ATTRIBUTE_NOT_FINISHED,"AttValue length too long\n");
      goto LAB_00157683;
    }
  }
  if (ctxt->instate == XML_PARSER_EOF) {
LAB_0015770f:
    local_68 = (byte *)0x0;
LAB_00157698:
    if (pxVar10 != (xmlChar *)0x0) {
      (*xmlFree)(pxVar10);
    }
    if (local_68 != (byte *)0x0) {
      (*xmlFree)(local_68);
      return (xmlChar *)0x0;
    }
    return (xmlChar *)0x0;
  }
  if (((normalize != 0) && (bVar4)) && (uVar20 != 0)) {
    do {
      if (pxVar10[uVar20 - 1] != ' ') goto LAB_001576ec;
      uVar20 = uVar20 - 1;
    } while (uVar20 != 0);
    uVar20 = 0;
  }
LAB_001576ec:
  pxVar10[uVar20] = '\0';
  xVar2 = *ctxt->input->cur;
  if (xVar2 == '<') {
    xmlFatalErr(ctxt,XML_ERR_LT_IN_ATTRIBUTE,(char *)0x0);
    goto LAB_00157777;
  }
  if (xVar28 == xVar2) {
    xmlNextChar(ctxt);
    goto LAB_00157777;
  }
  if (uVar8 == 0) {
LAB_00157765:
    msg = "AttValue: \' expected\n";
    error = XML_ERR_ATTRIBUTE_NOT_FINISHED;
  }
  else {
    if ((int)uVar8 < 0x100) {
      if ((0x1f < (int)uVar8) || ((uVar8 < 0xe && ((0x2600U >> (uVar8 & 0x1f) & 1) != 0))))
      goto LAB_00157765;
    }
    else if (uVar8 - 0x10000 < 0x100000 || (uVar8 - 0xe000 < 0x1ffe || uVar8 < 0xd800))
    goto LAB_00157765;
    msg = "invalid character in attribute value\n";
    error = XML_ERR_INVALID_CHAR;
  }
  xmlFatalErrMsg(ctxt,error,msg);
LAB_00157777:
  if (local_48 == (int *)0x0) {
    return pxVar10;
  }
  *local_48 = (int)uVar20;
  return pxVar10;
}

Assistant:

static xmlChar *
xmlParseAttValueInternal(xmlParserCtxtPtr ctxt, int *len, int *alloc,
                         int normalize)
{
    xmlChar limit = 0;
    const xmlChar *in = NULL, *start, *end, *last;
    xmlChar *ret = NULL;
    int line, col;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_HUGE_LENGTH :
                    XML_MAX_TEXT_LENGTH;

    GROW;
    in = (xmlChar *) CUR_PTR;
    line = ctxt->input->line;
    col = ctxt->input->col;
    if (*in != '"' && *in != '\'') {
        xmlFatalErr(ctxt, XML_ERR_ATTRIBUTE_NOT_STARTED, NULL);
        return (NULL);
    }
    ctxt->instate = XML_PARSER_ATTRIBUTE_VALUE;

    /*
     * try to handle in this routine the most common case where no
     * allocation of a new string is required and where content is
     * pure ASCII.
     */
    limit = *in++;
    col++;
    end = ctxt->input->end;
    start = in;
    if (in >= end) {
        GROW_PARSE_ATT_VALUE_INTERNAL(ctxt, in, start, end)
    }
    if (normalize) {
        /*
	 * Skip any leading spaces
	 */
	while ((in < end) && (*in != limit) &&
	       ((*in == 0x20) || (*in == 0x9) ||
	        (*in == 0xA) || (*in == 0xD))) {
	    if (*in == 0xA) {
	        line++; col = 1;
	    } else {
	        col++;
	    }
	    in++;
	    start = in;
	    if (in >= end) {
                GROW_PARSE_ATT_VALUE_INTERNAL(ctxt, in, start, end)
                if ((in - start) > maxLength) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                                   "AttValue length too long\n");
                    return(NULL);
                }
	    }
	}
	while ((in < end) && (*in != limit) && (*in >= 0x20) &&
	       (*in <= 0x7f) && (*in != '&') && (*in != '<')) {
	    col++;
	    if ((*in++ == 0x20) && (*in == 0x20)) break;
	    if (in >= end) {
                GROW_PARSE_ATT_VALUE_INTERNAL(ctxt, in, start, end)
                if ((in - start) > maxLength) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                                   "AttValue length too long\n");
                    return(NULL);
                }
	    }
	}
	last = in;
	/*
	 * skip the trailing blanks
	 */
	while ((last[-1] == 0x20) && (last > start)) last--;
	while ((in < end) && (*in != limit) &&
	       ((*in == 0x20) || (*in == 0x9) ||
	        (*in == 0xA) || (*in == 0xD))) {
	    if (*in == 0xA) {
	        line++, col = 1;
	    } else {
	        col++;
	    }
	    in++;
	    if (in >= end) {
		const xmlChar *oldbase = ctxt->input->base;
		GROW;
                if (ctxt->instate == XML_PARSER_EOF)
                    return(NULL);
		if (oldbase != ctxt->input->base) {
		    ptrdiff_t delta = ctxt->input->base - oldbase;
		    start = start + delta;
		    in = in + delta;
		    last = last + delta;
		}
		end = ctxt->input->end;
                if ((in - start) > maxLength) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                                   "AttValue length too long\n");
                    return(NULL);
                }
	    }
	}
        if ((in - start) > maxLength) {
            xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                           "AttValue length too long\n");
            return(NULL);
        }
	if (*in != limit) goto need_complex;
    } else {
	while ((in < end) && (*in != limit) && (*in >= 0x20) &&
	       (*in <= 0x7f) && (*in != '&') && (*in != '<')) {
	    in++;
	    col++;
	    if (in >= end) {
                GROW_PARSE_ATT_VALUE_INTERNAL(ctxt, in, start, end)
                if ((in - start) > maxLength) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                                   "AttValue length too long\n");
                    return(NULL);
                }
	    }
	}
	last = in;
        if ((in - start) > maxLength) {
            xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                           "AttValue length too long\n");
            return(NULL);
        }
	if (*in != limit) goto need_complex;
    }
    in++;
    col++;
    if (len != NULL) {
        if (alloc) *alloc = 0;
        *len = last - start;
        ret = (xmlChar *) start;
    } else {
        if (alloc) *alloc = 1;
        ret = xmlStrndup(start, last - start);
    }
    CUR_PTR = in;
    ctxt->input->line = line;
    ctxt->input->col = col;
    return ret;
need_complex:
    if (alloc) *alloc = 1;
    return xmlParseAttValueComplex(ctxt, len, normalize);
}